

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

MPP_RET hal_h265e_vepu511_gen_regs(void *hal,HalEncTask *task)

{
  H265eV511RegSet *regs_00;
  H265eSyntax_new *syn_00;
  VepuFmtCfg *fmt_00;
  H265eVepu511Frame *regs_01;
  EncFrmStatus *pEVar1;
  EncFrmStatus *frm;
  H265eVepu511Frame *reg_frm;
  VepuFmtCfg *fmt;
  H265eSyntax_new *syn;
  HalEncTask *enc_task;
  MPP_RET ret;
  H265eV511RegSet *regs;
  Vepu511H265eFrmCfg *frm_cfg;
  H265eV511HalContext *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  regs_00 = *(H265eV511RegSet **)(*(long *)((long)hal + 0x90) + 0x18);
  syn_00 = *(H265eSyntax_new **)((long)hal + 0x3c0);
  fmt_00 = *(VepuFmtCfg **)((long)hal + 0x3e0);
  regs_01 = &regs_00->reg_frm;
  pEVar1 = &task->rc_task->frm;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x888);
  }
  if ((hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","frame %d | type %d | start gen regs11",
               "hal_h265e_vepu511_gen_regs",(ulong)*(uint *)((long)hal + 0x3fc),
               (ulong)*(uint *)((long)hal + 0x374));
  }
  memset(regs_00,0,0x18d0);
  vepu511_h265_set_normal((H265eV511HalContext *)hal,regs_00);
  vepu511_h265_set_prep(hal,task,regs_00);
  vepu511_h265_set_me_regs((H265eV511HalContext *)hal,syn_00,regs_00);
  vepu511_h265_set_split(regs_00,*(MppEncCfgSet **)((long)hal + 0x3b0));
  vepu511_h265_set_hw_address((H265eV511HalContext *)hal,regs_01,task);
  vepu511_h265_set_pp_regs(regs_00,fmt_00,(MppEncPrepCfg *)(*(long *)((long)hal + 0x3b0) + 8),task);
  vepu511_h265_set_vsp_filtering((H265eV511HalContext *)hal,regs_00);
  vepu511_h265_set_rc_regs((H265eV511HalContext *)hal,regs_00,task);
  vepu511_h265_set_rdo_regs(regs_00);
  vepu511_h265_set_quant_regs((H265eV511HalContext *)hal,regs_00);
  vepu511_h265_set_sao_regs(regs_00);
  vepu511_h265_set_slice_regs(syn_00,regs_01);
  vepu511_h265_set_ref_regs(syn_00,regs_01);
  hal_local._4_4_ =
       vepu511_h265_set_patch_info
                 (syn_00,fmt_00->format,*(MppDevRegOffCfgs **)((long)hal + 0x3b8),task);
  if (hal_local._4_4_ == MPP_OK) {
    setup_vepu511_ext_line_buf((H265eV511HalContext *)hal,regs_00);
    vepu511_h265_set_atf_regs((H265eV511HalContext *)hal,regs_00);
    vepu511_h265_set_anti_stripe_regs((H265eV511HalContext *)hal,regs_00);
    vepu511_h265_set_atr_regs(regs_00);
    vepu511_h265_set_smear_regs((H265eV511HalContext *)hal,regs_00);
    vepu511_h265_set_scaling_list(regs_00);
    vepu511_h265_set_aq((H265eV511HalContext *)hal,regs_00);
    if (*(long *)((long)hal + 0x3a8) != 0) {
      vepu511_set_osd((Vepu511OsdCfg *)((long)hal + 0x390),&(regs_00->reg_osd).osd_comb_cfg);
    }
    if (*(long *)((long)hal + 0x388) != 0) {
      vepu511_set_roi(&(regs_00->reg_rc_roi).roi_cfg,*(MppEncROICfg **)((long)hal + 0x388),
                      *(RK_S32 *)(*(long *)((long)hal + 0x3b0) + 0xc),
                      *(RK_S32 *)(*(long *)((long)hal + 0x3b0) + 0x10));
    }
    vepu511_h265_global_cfg_set((H265eV511HalContext *)hal,regs_00);
    if ((pEVar1->val >> 2 & 1) != 0) {
      vepu511_h265e_save_pass1_patch
                (regs_00,(H265eV511HalContext *)hal,
                 (syn_00->pp).field_22.CodingSettingPicturePropertyFlags >> 7 & 1);
    }
    if ((pEVar1->val >> 3 & 1) != 0) {
      vepu511_h265e_use_pass1_patch(regs_00,(H265eV511HalContext *)hal);
    }
    *(int *)((long)hal + 0x3fc) = *(int *)((long)hal + 0x3fc) + 1;
    if ((hal_h265e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0x8bc);
    }
    hal_local._4_4_ = MPP_OK;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_h265e_vepu511_gen_regs(void *hal, HalEncTask *task)
{
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    Vepu511H265eFrmCfg *frm_cfg = ctx->frm;
    H265eV511RegSet *regs = frm_cfg->regs_set;
    MPP_RET ret = MPP_OK;

    HalEncTask *enc_task = task;
    H265eSyntax_new *syn = ctx->syn;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    H265eVepu511Frame *reg_frm = &regs->reg_frm;
    EncFrmStatus *frm = &task->rc_task->frm;

    hal_h265e_enter();

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs11",
                         ctx->frame_num, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV511RegSet));

    vepu511_h265_set_normal(ctx, regs);
    vepu511_h265_set_prep(ctx, task, regs);
    vepu511_h265_set_me_regs(ctx, syn , regs);
    vepu511_h265_set_split(regs, ctx->cfg);
    vepu511_h265_set_hw_address(ctx, reg_frm, task);
    vepu511_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep, task);
    vepu511_h265_set_vsp_filtering(ctx, regs);
    vepu511_h265_set_rc_regs(ctx, regs, task);
    vepu511_h265_set_rdo_regs(regs);
    vepu511_h265_set_quant_regs(ctx, regs);
    vepu511_h265_set_sao_regs(regs);
    vepu511_h265_set_slice_regs(syn, reg_frm);
    vepu511_h265_set_ref_regs(syn, reg_frm);

    ret = vepu511_h265_set_patch_info(syn, (Vepu541Fmt)fmt->format, ctx->reg_cfg, enc_task);
    if (ret)
        return ret;

    setup_vepu511_ext_line_buf(ctx, regs);
    vepu511_h265_set_atf_regs(ctx, regs);
    vepu511_h265_set_anti_stripe_regs(ctx, regs);
    vepu511_h265_set_atr_regs(regs);
    vepu511_h265_set_smear_regs(ctx, regs);
    vepu511_h265_set_scaling_list(regs);
    vepu511_h265_set_aq(ctx, regs);

    if (ctx->osd_cfg.osd_data3)
        vepu511_set_osd(&ctx->osd_cfg, &regs->reg_osd.osd_comb_cfg);

    if (ctx->roi_data)
        vepu511_set_roi(&regs->reg_rc_roi.roi_cfg, ctx->roi_data,
                        ctx->cfg->prep.width, ctx->cfg->prep.height);

    /*paramet cfg*/
    vepu511_h265_global_cfg_set(ctx, regs);

    /* two pass register patch */
    if (frm->save_pass1)
        vepu511_h265e_save_pass1_patch(regs, ctx, syn->pp.tiles_enabled_flag);

    if (frm->use_pass1)
        vepu511_h265e_use_pass1_patch(regs, ctx);

    ctx->frame_num++;

    hal_h265e_leave();
    return MPP_OK;
}